

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3MallocAlarm(int nByte)

{
  if ((0 < mem0.alarmThreshold) && (mem0.mutex != (sqlite3_mutex *)0x0)) {
    (*sqlite3Config.mutex.xMutexLeave)(mem0.mutex);
    if (mem0.mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(mem0.mutex);
      return;
    }
  }
  return;
}

Assistant:

static void sqlite3MallocAlarm(int nByte){
  if( mem0.alarmThreshold<=0 ) return;
  sqlite3_mutex_leave(mem0.mutex);
  sqlite3_release_memory(nByte);
  sqlite3_mutex_enter(mem0.mutex);
}